

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  byte bVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  NodeRef *pNVar18;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar67 [16];
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  NodeRef *local_1528;
  undefined1 local_14e8 [16];
  ulong local_14d8;
  long local_14d0;
  Scene *local_14c8;
  long local_14c0;
  undefined1 local_14b8 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [32];
  undefined1 local_13a8 [32];
  undefined1 local_1388 [32];
  undefined1 local_1368 [32];
  undefined1 local_1348 [32];
  undefined1 local_1328 [32];
  RTCHitN local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  uint local_1298;
  uint uStack_1294;
  uint uStack_1290;
  uint uStack_128c;
  uint uStack_1288;
  uint uStack_1284;
  uint uStack_1280;
  uint uStack_127c;
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  NodeRef stack [564];
  
  stack[0] = root;
  auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar78 = ZEXT3264(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar79 = ZEXT3264(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar80 = ZEXT3264(auVar46);
  fVar52 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar59 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar52 * 0.99999964)));
  auVar81 = ZEXT3264(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar59 * 0.99999964)));
  auVar82 = ZEXT3264(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar66 * 0.99999964)));
  auVar83 = ZEXT3264(auVar46);
  fVar52 = fVar52 * 1.0000004;
  fVar59 = fVar59 * 1.0000004;
  fVar66 = fVar66 * 1.0000004;
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar1 = (tray->tnear).field_0.i[k];
  local_1258._4_4_ = iVar1;
  local_1258._0_4_ = iVar1;
  local_1258._8_4_ = iVar1;
  local_1258._12_4_ = iVar1;
  local_1258._16_4_ = iVar1;
  local_1258._20_4_ = iVar1;
  local_1258._24_4_ = iVar1;
  local_1258._28_4_ = iVar1;
  auVar75 = ZEXT3264(local_1258);
  iVar1 = (tray->tfar).field_0.i[k];
  local_1278._4_4_ = iVar1;
  local_1278._0_4_ = iVar1;
  local_1278._8_4_ = iVar1;
  local_1278._12_4_ = iVar1;
  local_1278._16_4_ = iVar1;
  local_1278._20_4_ = iVar1;
  local_1278._24_4_ = iVar1;
  local_1278._28_4_ = iVar1;
  auVar76 = ZEXT3264(local_1278);
  auVar11 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_11f8 = fVar52;
  fStack_11f4 = fVar52;
  fStack_11f0 = fVar52;
  fStack_11ec = fVar52;
  fStack_11e8 = fVar52;
  fStack_11e4 = fVar52;
  fStack_11e0 = fVar52;
  fStack_11dc = fVar52;
  local_1218 = fVar59;
  fStack_1214 = fVar59;
  fStack_1210 = fVar59;
  fStack_120c = fVar59;
  fStack_1208 = fVar59;
  fStack_1204 = fVar59;
  fStack_1200 = fVar59;
  fStack_11fc = fVar59;
  local_1238 = fVar66;
  fStack_1234 = fVar66;
  fStack_1230 = fVar66;
  fStack_122c = fVar66;
  fStack_1228 = fVar66;
  fStack_1224 = fVar66;
  fStack_1220 = fVar66;
  fStack_121c = fVar66;
  local_1528 = stack + 1;
  fVar53 = fVar52;
  fVar54 = fVar52;
  fVar55 = fVar52;
  fVar56 = fVar52;
  fVar57 = fVar52;
  fVar58 = fVar52;
  fVar60 = fVar59;
  fVar61 = fVar59;
  fVar62 = fVar59;
  fVar63 = fVar59;
  fVar64 = fVar59;
  fVar65 = fVar59;
  fVar68 = fVar66;
  fVar69 = fVar66;
  fVar70 = fVar66;
  fVar71 = fVar66;
  fVar72 = fVar66;
  fVar73 = fVar66;
LAB_01da102b:
  do {
    pNVar18 = local_1528;
    if (pNVar18 == stack) {
LAB_01da1a1d:
      return pNVar18 != stack;
    }
    local_1528 = pNVar18 + -1;
    sVar20 = pNVar18[-1].ptr;
    while ((sVar20 & 8) == 0) {
      uVar13 = sVar20 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar51._4_4_ = uVar2;
      auVar51._0_4_ = uVar2;
      auVar51._8_4_ = uVar2;
      auVar51._12_4_ = uVar2;
      auVar51._16_4_ = uVar2;
      auVar51._20_4_ = uVar2;
      auVar51._24_4_ = uVar2;
      auVar51._28_4_ = uVar2;
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar19),auVar51,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar19));
      auVar46 = vsubps_avx512vl(ZEXT1632(auVar45),auVar78._0_32_);
      auVar46 = vmulps_avx512vl(auVar81._0_32_,auVar46);
      auVar46 = vmaxps_avx(auVar75._0_32_,auVar46);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar15),auVar51,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar15));
      auVar47 = vsubps_avx512vl(ZEXT1632(auVar45),auVar79._0_32_);
      auVar47 = vmulps_avx512vl(auVar82._0_32_,auVar47);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar21),auVar51,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar21));
      auVar48 = vsubps_avx512vl(ZEXT1632(auVar45),auVar80._0_32_);
      auVar48 = vmulps_avx512vl(auVar83._0_32_,auVar48);
      auVar47 = vmaxps_avx(auVar47,auVar48);
      auVar46 = vmaxps_avx(auVar46,auVar47);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + (uVar19 ^ 0x20)),auVar51,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + (uVar19 ^ 0x20)));
      auVar48 = vsubps_avx512vl(ZEXT1632(auVar45),auVar78._0_32_);
      auVar47._4_4_ = fVar53 * auVar48._4_4_;
      auVar47._0_4_ = fVar52 * auVar48._0_4_;
      auVar47._8_4_ = fVar54 * auVar48._8_4_;
      auVar47._12_4_ = fVar55 * auVar48._12_4_;
      auVar47._16_4_ = fVar56 * auVar48._16_4_;
      auVar47._20_4_ = fVar57 * auVar48._20_4_;
      auVar47._24_4_ = fVar58 * auVar48._24_4_;
      auVar47._28_4_ = auVar48._28_4_;
      auVar47 = vminps_avx(auVar76._0_32_,auVar47);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + (uVar15 ^ 0x20)),auVar51,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + (uVar15 ^ 0x20)));
      auVar49 = vsubps_avx512vl(ZEXT1632(auVar45),auVar79._0_32_);
      auVar48._4_4_ = fVar60 * auVar49._4_4_;
      auVar48._0_4_ = fVar59 * auVar49._0_4_;
      auVar48._8_4_ = fVar61 * auVar49._8_4_;
      auVar48._12_4_ = fVar62 * auVar49._12_4_;
      auVar48._16_4_ = fVar63 * auVar49._16_4_;
      auVar48._20_4_ = fVar64 * auVar49._20_4_;
      auVar48._24_4_ = fVar65 * auVar49._24_4_;
      auVar48._28_4_ = auVar49._28_4_;
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + (uVar21 ^ 0x20)),auVar51,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + (uVar21 ^ 0x20)));
      auVar50 = vsubps_avx512vl(ZEXT1632(auVar45),auVar80._0_32_);
      auVar49._4_4_ = fVar68 * auVar50._4_4_;
      auVar49._0_4_ = fVar66 * auVar50._0_4_;
      auVar49._8_4_ = fVar69 * auVar50._8_4_;
      auVar49._12_4_ = fVar70 * auVar50._12_4_;
      auVar49._16_4_ = fVar71 * auVar50._16_4_;
      auVar49._20_4_ = fVar72 * auVar50._20_4_;
      auVar49._24_4_ = fVar73 * auVar50._24_4_;
      auVar49._28_4_ = auVar50._28_4_;
      auVar48 = vminps_avx(auVar48,auVar49);
      auVar47 = vminps_avx(auVar47,auVar48);
      if (((uint)sVar20 & 7) == 6) {
        uVar8 = vcmpps_avx512vl(auVar46,auVar47,2);
        uVar9 = vcmpps_avx512vl(auVar51,*(undefined1 (*) [32])(uVar13 + 0x1c0),0xd);
        uVar10 = vcmpps_avx512vl(auVar51,*(undefined1 (*) [32])(uVar13 + 0x1e0),1);
        uVar16 = (uint)uVar8 & (uint)uVar9 & (uint)uVar10;
      }
      else {
        uVar8 = vcmpps_avx512vl(auVar46,auVar47,2);
        uVar16 = (uint)uVar8;
      }
      if ((byte)uVar16 == 0) goto LAB_01da102b;
      lVar14 = 0;
      for (uVar17 = (ulong)(byte)uVar16; (uVar17 & 1) == 0;
          uVar17 = uVar17 >> 1 | 0x8000000000000000) {
        lVar14 = lVar14 + 1;
      }
      sVar20 = *(size_t *)(uVar13 + lVar14 * 8);
      uVar16 = (uVar16 & 0xff) - 1 & uVar16 & 0xff;
      uVar17 = (ulong)uVar16;
      if (uVar16 != 0) {
        do {
          local_1528->ptr = sVar20;
          local_1528 = local_1528 + 1;
          lVar14 = 0;
          for (uVar22 = uVar17; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
            lVar14 = lVar14 + 1;
          }
          uVar17 = uVar17 - 1 & uVar17;
          sVar20 = *(size_t *)(uVar13 + lVar14 * 8);
        } while (uVar17 != 0);
      }
    }
    local_14c0 = (ulong)((uint)sVar20 & 0xf) - 8;
    uVar13 = sVar20 & 0xfffffffffffffff0;
    for (local_14d0 = 0; local_14d0 != local_14c0; local_14d0 = local_14d0 + 1) {
      lVar14 = local_14d0 * 0x140;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar32._4_4_ = uVar2;
      auVar32._0_4_ = uVar2;
      auVar32._8_4_ = uVar2;
      auVar32._12_4_ = uVar2;
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x90 + lVar14),auVar32,
                                *(undefined1 (*) [16])(uVar13 + lVar14));
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xa0 + lVar14),auVar32,
                                *(undefined1 (*) [16])(uVar13 + 0x10 + lVar14));
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xb0 + lVar14),auVar32,
                                *(undefined1 (*) [16])(uVar13 + 0x20 + lVar14));
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xc0 + lVar14),auVar32,
                                *(undefined1 (*) [16])(uVar13 + 0x30 + lVar14));
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xd0 + lVar14),auVar32,
                                *(undefined1 (*) [16])(uVar13 + 0x40 + lVar14));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xe0 + lVar14),auVar32,
                                *(undefined1 (*) [16])(uVar13 + 0x50 + lVar14));
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xf0 + lVar14),auVar32,
                                *(undefined1 (*) [16])(uVar13 + 0x60 + lVar14));
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x100 + lVar14),auVar32,
                                *(undefined1 (*) [16])(uVar13 + 0x70 + lVar14));
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x110 + lVar14),auVar32,
                                *(undefined1 (*) [16])(uVar13 + 0x80 + lVar14));
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar33._4_4_ = uVar2;
      auVar33._0_4_ = uVar2;
      auVar33._8_4_ = uVar2;
      auVar33._12_4_ = uVar2;
      auVar23 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
      auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar67._4_4_ = uVar2;
      auVar67._0_4_ = uVar2;
      auVar67._8_4_ = uVar2;
      auVar67._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar74._4_4_ = uVar2;
      auVar74._0_4_ = uVar2;
      auVar74._8_4_ = uVar2;
      auVar74._12_4_ = uVar2;
      fVar52 = *(float *)(ray + k * 4 + 0x60);
      auVar77._4_4_ = fVar52;
      auVar77._0_4_ = fVar52;
      auVar77._8_4_ = fVar52;
      auVar77._12_4_ = fVar52;
      auVar45 = vsubps_avx(auVar45,auVar33);
      auVar25 = vsubps_avx512vl(auVar44,auVar23);
      auVar26 = vsubps_avx512vl(auVar39,auVar24);
      auVar27 = vsubps_avx512vl(auVar27,auVar33);
      auVar28 = vsubps_avx512vl(auVar28,auVar23);
      auVar29 = vsubps_avx512vl(auVar29,auVar24);
      auVar30 = vsubps_avx512vl(auVar30,auVar33);
      auVar31 = vsubps_avx512vl(auVar31,auVar23);
      auVar32 = vsubps_avx512vl(auVar32,auVar24);
      auVar23 = vsubps_avx512vl(auVar30,auVar45);
      auVar24 = vsubps_avx512vl(auVar31,auVar25);
      auVar44 = vsubps_avx(auVar32,auVar26);
      auVar33 = vsubps_avx512vl(auVar45,auVar27);
      auVar34 = vsubps_avx512vl(auVar25,auVar28);
      auVar35 = vsubps_avx512vl(auVar26,auVar29);
      auVar36 = vsubps_avx512vl(auVar27,auVar30);
      auVar37 = vsubps_avx512vl(auVar28,auVar31);
      auVar38 = vsubps_avx512vl(auVar29,auVar32);
      auVar39 = vaddps_avx512vl(auVar30,auVar45);
      auVar40 = vaddps_avx512vl(auVar31,auVar25);
      auVar41 = vaddps_avx512vl(auVar32,auVar26);
      auVar42 = vmulps_avx512vl(auVar40,auVar44);
      auVar42 = vfmsub231ps_avx512vl(auVar42,auVar24,auVar41);
      auVar41 = vmulps_avx512vl(auVar41,auVar23);
      auVar41 = vfmsub231ps_avx512vl(auVar41,auVar44,auVar39);
      auVar43._0_4_ = auVar24._0_4_ * auVar39._0_4_;
      auVar43._4_4_ = auVar24._4_4_ * auVar39._4_4_;
      auVar43._8_4_ = auVar24._8_4_ * auVar39._8_4_;
      auVar43._12_4_ = auVar24._12_4_ * auVar39._12_4_;
      auVar39 = vfmsub231ps_fma(auVar43,auVar23,auVar40);
      auVar40._0_4_ = fVar52 * auVar39._0_4_;
      auVar40._4_4_ = fVar52 * auVar39._4_4_;
      auVar40._8_4_ = fVar52 * auVar39._8_4_;
      auVar40._12_4_ = fVar52 * auVar39._12_4_;
      auVar39 = vfmadd231ps_avx512vl(auVar40,auVar74,auVar41);
      auVar40 = vfmadd231ps_avx512vl(auVar39,auVar67,auVar42);
      auVar39 = vaddps_avx512vl(auVar45,auVar27);
      auVar41 = vaddps_avx512vl(auVar25,auVar28);
      auVar42 = vaddps_avx512vl(auVar26,auVar29);
      auVar43 = vmulps_avx512vl(auVar41,auVar35);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar34,auVar42);
      auVar42 = vmulps_avx512vl(auVar42,auVar33);
      auVar42 = vfmsub231ps_avx512vl(auVar42,auVar35,auVar39);
      auVar39 = vmulps_avx512vl(auVar39,auVar34);
      auVar39 = vfmsub231ps_avx512vl(auVar39,auVar33,auVar41);
      auVar41._0_4_ = fVar52 * auVar39._0_4_;
      auVar41._4_4_ = fVar52 * auVar39._4_4_;
      auVar41._8_4_ = fVar52 * auVar39._8_4_;
      auVar41._12_4_ = fVar52 * auVar39._12_4_;
      auVar39 = vfmadd231ps_avx512vl(auVar41,auVar74,auVar42);
      auVar41 = vfmadd231ps_avx512vl(auVar39,auVar67,auVar43);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar39 = vaddps_avx512vl(auVar27,auVar30);
      auVar27 = vaddps_avx512vl(auVar28,auVar31);
      auVar28 = vaddps_avx512vl(auVar29,auVar32);
      auVar29 = vmulps_avx512vl(auVar27,auVar38);
      auVar29 = vfmsub231ps_avx512vl(auVar29,auVar37,auVar28);
      auVar30._0_4_ = auVar28._0_4_ * auVar36._0_4_;
      auVar30._4_4_ = auVar28._4_4_ * auVar36._4_4_;
      auVar30._8_4_ = auVar28._8_4_ * auVar36._8_4_;
      auVar30._12_4_ = auVar28._12_4_ * auVar36._12_4_;
      auVar28 = vfmsub231ps_avx512vl(auVar30,auVar38,auVar39);
      auVar39 = vmulps_avx512vl(auVar39,auVar37);
      auVar39 = vfmsub231ps_avx512vl(auVar39,auVar36,auVar27);
      auVar39 = vmulps_avx512vl(auVar39,auVar77);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar74,auVar28);
      auVar28 = vfmadd231ps_avx512vl(auVar39,auVar67,auVar29);
      auVar29._0_4_ = auVar40._0_4_ + auVar41._0_4_;
      auVar29._4_4_ = auVar40._4_4_ + auVar41._4_4_;
      auVar29._8_4_ = auVar40._8_4_ + auVar41._8_4_;
      auVar29._12_4_ = auVar40._12_4_ + auVar41._12_4_;
      auVar29 = vaddps_avx512vl(auVar28,auVar29);
      auVar30 = vandps_avx512vl(auVar29,auVar42);
      auVar39._8_4_ = 0x34000000;
      auVar39._0_8_ = 0x3400000034000000;
      auVar39._12_4_ = 0x34000000;
      auVar39 = vmulps_avx512vl(auVar30,auVar39);
      auVar27 = vminps_avx512vl(auVar40,auVar41);
      auVar31 = vminps_avx512vl(auVar27,auVar28);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      auVar27 = vxorps_avx512vl(auVar39,auVar27);
      uVar8 = vcmpps_avx512vl(auVar31,auVar27,5);
      auVar27 = vmaxps_avx512vl(auVar40,auVar41);
      auVar27 = vmaxps_avx512vl(auVar27,auVar28);
      uVar9 = vcmpps_avx512vl(auVar27,auVar39,2);
      bVar12 = ((byte)uVar8 | (byte)uVar9) & 0xf;
      if (bVar12 != 0) {
        auVar39 = vmulps_avx512vl(auVar34,auVar44);
        auVar27 = vmulps_avx512vl(auVar23,auVar35);
        auVar28 = vmulps_avx512vl(auVar33,auVar24);
        auVar31 = vmulps_avx512vl(auVar37,auVar35);
        auVar32 = vmulps_avx512vl(auVar33,auVar38);
        auVar43 = vmulps_avx512vl(auVar36,auVar34);
        auVar24 = vfmsub213ps_avx512vl(auVar24,auVar35,auVar39);
        auVar44 = vfmsub213ps_avx512vl(auVar44,auVar33,auVar27);
        auVar23 = vfmsub213ps_avx512vl(auVar23,auVar34,auVar28);
        auVar34 = vfmsub213ps_avx512vl(auVar38,auVar34,auVar31);
        auVar35 = vfmsub213ps_avx512vl(auVar36,auVar35,auVar32);
        auVar33 = vfmsub213ps_avx512vl(auVar37,auVar33,auVar43);
        auVar39 = vandps_avx512vl(auVar39,auVar42);
        auVar31 = vandps_avx512vl(auVar31,auVar42);
        uVar17 = vcmpps_avx512vl(auVar39,auVar31,1);
        auVar39 = vandps_avx512vl(auVar27,auVar42);
        auVar27 = vandps_avx512vl(auVar32,auVar42);
        uVar22 = vcmpps_avx512vl(auVar39,auVar27,1);
        auVar39 = vandps_avx512vl(auVar28,auVar42);
        auVar27 = vandps_avx512vl(auVar43,auVar42);
        uVar7 = vcmpps_avx512vl(auVar39,auVar27,1);
        bVar6 = (bool)((byte)uVar17 & 1);
        local_13f8._0_4_ = (uint)bVar6 * auVar24._0_4_ | (uint)!bVar6 * auVar34._0_4_;
        bVar6 = (bool)((byte)(uVar17 >> 1) & 1);
        local_13f8._4_4_ = (uint)bVar6 * auVar24._4_4_ | (uint)!bVar6 * auVar34._4_4_;
        bVar6 = (bool)((byte)(uVar17 >> 2) & 1);
        local_13f8._8_4_ = (uint)bVar6 * auVar24._8_4_ | (uint)!bVar6 * auVar34._8_4_;
        bVar6 = (bool)((byte)(uVar17 >> 3) & 1);
        local_13f8._12_4_ = (uint)bVar6 * auVar24._12_4_ | (uint)!bVar6 * auVar34._12_4_;
        bVar6 = (bool)((byte)uVar22 & 1);
        local_13e8._0_4_ = (uint)bVar6 * auVar44._0_4_ | (uint)!bVar6 * auVar35._0_4_;
        bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
        local_13e8._4_4_ = (uint)bVar6 * auVar44._4_4_ | (uint)!bVar6 * auVar35._4_4_;
        bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
        local_13e8._8_4_ = (uint)bVar6 * auVar44._8_4_ | (uint)!bVar6 * auVar35._8_4_;
        bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
        local_13e8._12_4_ = (uint)bVar6 * auVar44._12_4_ | (uint)!bVar6 * auVar35._12_4_;
        bVar6 = (bool)((byte)uVar7 & 1);
        local_13d8._0_4_ = (float)((uint)bVar6 * auVar23._0_4_ | (uint)!bVar6 * auVar33._0_4_);
        bVar6 = (bool)((byte)(uVar7 >> 1) & 1);
        local_13d8._4_4_ = (float)((uint)bVar6 * auVar23._4_4_ | (uint)!bVar6 * auVar33._4_4_);
        bVar6 = (bool)((byte)(uVar7 >> 2) & 1);
        local_13d8._8_4_ = (float)((uint)bVar6 * auVar23._8_4_ | (uint)!bVar6 * auVar33._8_4_);
        bVar6 = (bool)((byte)(uVar7 >> 3) & 1);
        local_13d8._12_4_ = (float)((uint)bVar6 * auVar23._12_4_ | (uint)!bVar6 * auVar33._12_4_);
        auVar24._0_4_ = fVar52 * local_13d8._0_4_;
        auVar24._4_4_ = fVar52 * local_13d8._4_4_;
        auVar24._8_4_ = fVar52 * local_13d8._8_4_;
        auVar24._12_4_ = fVar52 * local_13d8._12_4_;
        auVar44 = vfmadd213ps_fma(auVar74,local_13e8,auVar24);
        auVar44 = vfmadd213ps_fma(auVar67,local_13f8,auVar44);
        auVar28._0_4_ = auVar44._0_4_ + auVar44._0_4_;
        auVar28._4_4_ = auVar44._4_4_ + auVar44._4_4_;
        auVar28._8_4_ = auVar44._8_4_ + auVar44._8_4_;
        auVar28._12_4_ = auVar44._12_4_ + auVar44._12_4_;
        auVar31._0_4_ = auVar26._0_4_ * local_13d8._0_4_;
        auVar31._4_4_ = auVar26._4_4_ * local_13d8._4_4_;
        auVar31._8_4_ = auVar26._8_4_ * local_13d8._8_4_;
        auVar31._12_4_ = auVar26._12_4_ * local_13d8._12_4_;
        auVar44 = vfmadd213ps_fma(auVar25,local_13e8,auVar31);
        auVar44 = vfmadd213ps_fma(auVar45,local_13f8,auVar44);
        auVar39 = vrcp14ps_avx512vl(auVar28);
        auVar45._8_4_ = 0x3f800000;
        auVar45._0_8_ = 0x3f8000003f800000;
        auVar45._12_4_ = 0x3f800000;
        auVar45 = vfnmadd213ps_avx512vl(auVar39,auVar28,auVar45);
        auVar45 = vfmadd132ps_fma(auVar45,auVar39,auVar39);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar23._4_4_ = uVar2;
        auVar23._0_4_ = uVar2;
        auVar23._8_4_ = uVar2;
        auVar23._12_4_ = uVar2;
        auVar75 = ZEXT1664(auVar23);
        local_1408._0_4_ = auVar45._0_4_ * (auVar44._0_4_ + auVar44._0_4_);
        local_1408._4_4_ = auVar45._4_4_ * (auVar44._4_4_ + auVar44._4_4_);
        local_1408._8_4_ = auVar45._8_4_ * (auVar44._8_4_ + auVar44._8_4_);
        local_1408._12_4_ = auVar45._12_4_ * (auVar44._12_4_ + auVar44._12_4_);
        uVar8 = vcmpps_avx512vl(local_1408,auVar23,2);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar44._4_4_ = uVar2;
        auVar44._0_4_ = uVar2;
        auVar44._8_4_ = uVar2;
        auVar44._12_4_ = uVar2;
        uVar9 = vcmpps_avx512vl(local_1408,auVar44,0xd);
        bVar12 = (byte)uVar8 & (byte)uVar9 & bVar12;
        if (bVar12 != 0) {
          uVar8 = vcmpps_avx512vl(auVar28,_DAT_01f45a50,4);
          bVar12 = bVar12 & (byte)uVar8;
          if (bVar12 != 0) {
            auVar25._8_4_ = 0x219392ef;
            auVar25._0_8_ = 0x219392ef219392ef;
            auVar25._12_4_ = 0x219392ef;
            uVar17 = vcmpps_avx512vl(auVar30,auVar25,5);
            auVar44 = vrcp14ps_avx512vl(auVar29);
            auVar35._8_4_ = 0x3f800000;
            auVar35._0_8_ = 0x3f8000003f800000;
            auVar35._12_4_ = 0x3f800000;
            auVar45 = vfnmadd213ps_fma(auVar29,auVar44,auVar35);
            auVar45 = vfmadd132ps_avx512vl(auVar45,auVar44,auVar44);
            fVar53 = (float)((uint)((byte)uVar17 & 1) * auVar45._0_4_);
            fVar66 = (float)((uint)((byte)(uVar17 >> 1) & 1) * auVar45._4_4_);
            fVar59 = (float)((uint)((byte)(uVar17 >> 2) & 1) * auVar45._8_4_);
            fVar52 = (float)((uint)((byte)(uVar17 >> 3) & 1) * auVar45._12_4_);
            local_14c8 = context->scene;
            auVar26._0_4_ = fVar53 * auVar40._0_4_;
            auVar26._4_4_ = fVar66 * auVar40._4_4_;
            auVar26._8_4_ = fVar59 * auVar40._8_4_;
            auVar26._12_4_ = fVar52 * auVar40._12_4_;
            local_1428 = vminps_avx(auVar26,auVar35);
            auVar34._0_4_ = fVar53 * auVar41._0_4_;
            auVar34._4_4_ = fVar66 * auVar41._4_4_;
            auVar34._8_4_ = fVar59 * auVar41._8_4_;
            auVar34._12_4_ = fVar52 * auVar41._12_4_;
            local_1418 = vminps_avx(auVar34,auVar35);
            local_14d8 = (ulong)bVar12;
            do {
              uVar17 = 0;
              for (uVar22 = local_14d8; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000
                  ) {
                uVar17 = uVar17 + 1;
              }
              pGVar4 = (local_14c8->geometries).items
                       [*(uint *)(lVar14 + uVar13 + 0x120 + uVar17 * 4)].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                local_14d8 = local_14d8 ^ 1L << (uVar17 & 0x3f);
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01da1a09:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  goto LAB_01da1a1d;
                }
                uVar22 = (ulong)(uint)((int)uVar17 * 4);
                uVar2 = *(undefined4 *)(local_1428 + uVar22);
                local_12d8._4_4_ = uVar2;
                local_12d8._0_4_ = uVar2;
                local_12d8._8_4_ = uVar2;
                local_12d8._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_1418 + uVar22);
                local_12c8._4_4_ = uVar2;
                local_12c8._0_4_ = uVar2;
                local_12c8._8_4_ = uVar2;
                local_12c8._12_4_ = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar22);
                args.context = context->user;
                local_12a8 = vpbroadcastd_avx512vl();
                uVar2 = *(undefined4 *)(lVar14 + uVar13 + 0x130 + uVar22);
                local_12b8._4_4_ = uVar2;
                local_12b8._0_4_ = uVar2;
                local_12b8._8_4_ = uVar2;
                local_12b8._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_13f8 + uVar22);
                uVar3 = *(undefined4 *)(local_13e8 + uVar22);
                local_12f8._4_4_ = uVar3;
                local_12f8._0_4_ = uVar3;
                local_12f8._8_4_ = uVar3;
                local_12f8._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_13d8 + uVar22);
                local_12e8._4_4_ = uVar3;
                local_12e8._0_4_ = uVar3;
                local_12e8._8_4_ = uVar3;
                local_12e8._12_4_ = uVar3;
                local_1308[0] = (RTCHitN)(char)uVar2;
                local_1308[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_1308[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_1308[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_1308[4] = (RTCHitN)(char)uVar2;
                local_1308[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_1308[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_1308[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_1308[8] = (RTCHitN)(char)uVar2;
                local_1308[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_1308[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_1308[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_1308[0xc] = (RTCHitN)(char)uVar2;
                local_1308[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_1308[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_1308[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                vpcmpeqd_avx2(ZEXT1632(local_12a8),ZEXT1632(local_12a8));
                uStack_1294 = (args.context)->instID[0];
                local_1298 = uStack_1294;
                uStack_1290 = uStack_1294;
                uStack_128c = uStack_1294;
                uStack_1288 = (args.context)->instPrimID[0];
                uStack_1284 = uStack_1288;
                uStack_1280 = uStack_1288;
                uStack_127c = uStack_1288;
                args.valid = (int *)local_14e8;
                args.geometryUserPtr = pGVar4->userPtr;
                args.hit = local_1308;
                args.N = 4;
                local_1328 = auVar78._0_32_;
                local_1348 = auVar79._0_32_;
                local_1368 = auVar80._0_32_;
                local_1388 = auVar81._0_32_;
                local_13a8 = auVar82._0_32_;
                local_13c8 = auVar83._0_32_;
                local_14b8 = auVar75._0_16_;
                local_14e8 = auVar11;
                args.ray = (RTCRayN *)ray;
                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar4->occlusionFilterN)(&args);
                  auVar75 = ZEXT1664(local_14b8);
                  auVar83 = ZEXT3264(local_13c8);
                  auVar82 = ZEXT3264(local_13a8);
                  auVar81 = ZEXT3264(local_1388);
                  auVar80 = ZEXT3264(local_1368);
                  auVar79 = ZEXT3264(local_1348);
                  auVar78 = ZEXT3264(local_1328);
                }
                uVar22 = vptestmd_avx512vl(local_14e8,local_14e8);
                if ((uVar22 & 0xf) != 0) {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var5)(&args);
                    auVar75 = ZEXT1664(local_14b8);
                    auVar83 = ZEXT3264(local_13c8);
                    auVar82 = ZEXT3264(local_13a8);
                    auVar81 = ZEXT3264(local_1388);
                    auVar80 = ZEXT3264(local_1368);
                    auVar79 = ZEXT3264(local_1348);
                    auVar78 = ZEXT3264(local_1328);
                  }
                  auVar45 = *(undefined1 (*) [16])(args.ray + 0x80);
                  uVar22 = vptestmd_avx512vl(local_14e8,local_14e8);
                  uVar22 = uVar22 & 0xf;
                  auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar6 = (bool)((byte)uVar22 & 1);
                  auVar36._0_4_ = (uint)bVar6 * auVar44._0_4_ | (uint)!bVar6 * auVar45._0_4_;
                  bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
                  auVar36._4_4_ = (uint)bVar6 * auVar44._4_4_ | (uint)!bVar6 * auVar45._4_4_;
                  bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
                  auVar36._8_4_ = (uint)bVar6 * auVar44._8_4_ | (uint)!bVar6 * auVar45._8_4_;
                  bVar6 = SUB81(uVar22 >> 3,0);
                  auVar36._12_4_ = (uint)bVar6 * auVar44._12_4_ | (uint)!bVar6 * auVar45._12_4_;
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar36;
                  if ((byte)uVar22 != 0) goto LAB_01da1a09;
                }
                *(int *)(ray + k * 4 + 0x80) = auVar75._0_4_;
                local_14d8 = local_14d8 ^ 1L << (uVar17 & 0x3f);
              }
            } while (local_14d8 != 0);
          }
        }
      }
      auVar75 = ZEXT3264(local_1258);
      auVar76 = ZEXT3264(local_1278);
      fVar52 = local_11f8;
      fVar53 = fStack_11f4;
      fVar54 = fStack_11f0;
      fVar55 = fStack_11ec;
      fVar56 = fStack_11e8;
      fVar57 = fStack_11e4;
      fVar58 = fStack_11e0;
      fVar59 = local_1218;
      fVar60 = fStack_1214;
      fVar61 = fStack_1210;
      fVar62 = fStack_120c;
      fVar63 = fStack_1208;
      fVar64 = fStack_1204;
      fVar65 = fStack_1200;
      fVar66 = local_1238;
      fVar68 = fStack_1234;
      fVar69 = fStack_1230;
      fVar70 = fStack_122c;
      fVar71 = fStack_1228;
      fVar72 = fStack_1224;
      fVar73 = fStack_1220;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }